

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O0

void Fraig_TablePrintStatsF0(Fraig_Man_t *pMan)

{
  Fraig_HashTable_t *pFVar1;
  int local_24;
  int Counter;
  int i;
  Fraig_Node_t *pNode;
  Fraig_HashTable_t *pT;
  Fraig_Man_t *pMan_local;
  
  pFVar1 = pMan->pTableF0;
  printf("Zero-node table. Table size = %d. Number of entries = %d.\n",(ulong)(uint)pFVar1->nBins,
         (ulong)(uint)pFVar1->nEntries);
  for (local_24 = 0; local_24 < pFVar1->nBins; local_24 = local_24 + 1) {
    for (_Counter = pFVar1->pBins[local_24]; _Counter != (Fraig_Node_t *)0x0;
        _Counter = _Counter->pNextF) {
    }
  }
  printf("\n");
  return;
}

Assistant:

void Fraig_TablePrintStatsF0( Fraig_Man_t * pMan )
{
    Fraig_HashTable_t * pT = pMan->pTableF0;
    Fraig_Node_t * pNode;
    int i, Counter;

    printf( "Zero-node table. Table size = %d. Number of entries = %d.\n", pT->nBins, pT->nEntries );
    for ( i = 0; i < pT->nBins; i++ )
    {
        Counter = 0;
        Fraig_TableBinForEachEntryF( pT->pBins[i], pNode )
            Counter++;
        if ( Counter == 0 )
            continue;
/*
        printf( "\nBin = %4d :  Number of entries = %4d\n", i, Counter );
        Fraig_TableBinForEachEntryF( pT->pBins[i], pNode )
            printf( "Node %5d. Hash = %10d.\n", pNode->Num, pNode->uHashD );
*/
    }
    printf( "\n" );
}